

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

int NV21ToNV12(uint8_t *src_y,int src_stride_y,uint8_t *src_vu,int src_stride_vu,uint8_t *dst_y,
              int dst_stride_y,uint8_t *dst_uv,int dst_stride_uv,int width,int height)

{
  int iVar1;
  uint height_00;
  
  iVar1 = -1;
  if ((height != 0 && 0 < width) && (dst_uv != (uint8_t *)0x0 && src_vu != (uint8_t *)0x0)) {
    if (dst_y != (uint8_t *)0x0) {
      CopyPlane(src_y,src_stride_y,dst_y,dst_stride_y,width,height);
    }
    if (height < 0) {
      height_00 = 1U - height >> 1;
      src_vu = src_vu + (int)((height_00 - 1) * src_stride_vu);
      src_stride_vu = -src_stride_vu;
    }
    else {
      height_00 = height + 1 >> 1;
    }
    SwapUVPlane(src_vu,src_stride_vu,dst_uv,dst_stride_uv,width + 1 >> 1,height_00);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int NV21ToNV12(const uint8_t* src_y,
               int src_stride_y,
               const uint8_t* src_vu,
               int src_stride_vu,
               uint8_t* dst_y,
               int dst_stride_y,
               uint8_t* dst_uv,
               int dst_stride_uv,
               int width,
               int height) {
  int halfwidth = (width + 1) >> 1;
  int halfheight = (height + 1) >> 1;
  if (!src_vu || !dst_uv || width <= 0 || height == 0) {
    return -1;
  }
  if (dst_y) {
    CopyPlane(src_y, src_stride_y, dst_y, dst_stride_y, width, height);
  }

  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    halfheight = (height + 1) >> 1;
    src_vu = src_vu + (halfheight - 1) * src_stride_vu;
    src_stride_vu = -src_stride_vu;
  }

  SwapUVPlane(src_vu, src_stride_vu, dst_uv, dst_stride_uv, halfwidth,
              halfheight);
  return 0;
}